

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Gia_ManFindAnnotatedDelay(Gia_Man_t *p,int DelayC,int *pnBoxes,int fIgnoreBoxDelays)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int local_60;
  int local_5c;
  
  iVar3 = Gia_ManBoxNum(p);
  if (iVar3 == 0) {
    iVar3 = p->vCis->nSize;
  }
  else {
    iVar3 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  }
  piVar1 = p->vLevels->pArray;
  local_5c = 0;
  Vec_IntFill(p->vLevels,p->nObjs,0);
  local_60 = 0;
  for (lVar7 = 1; lVar7 < p->nObjs; lVar7 = lVar7 + 1) {
    iVar4 = (int)lVar7;
    pGVar6 = Gia_ManObj(p,iVar4);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar2 = *(ulong *)pGVar6;
    uVar9 = (uint)uVar2;
    uVar8 = (uint)(uVar2 >> 0x20);
    if ((~uVar9 & 0x9fffffff) == 0) {
      if ((fIgnoreBoxDelays == 0) && (uVar9 = (uVar8 & 0x1fffffff) - iVar3, -1 < (int)uVar9)) {
        iVar4 = Gia_ManBoxNum(p);
        if (iVar4 <= (int)(uVar9 >> 1)) {
          __assert_fail("iBox < Gia_ManBoxNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x423,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
        }
        iVar4 = 0;
        for (iVar10 = 0; iVar10 != 3; iVar10 = iVar10 + 1) {
          pGVar6 = Gia_ManCo(p,iVar10 + (uVar9 >> 1) * 3);
          iVar5 = Gia_ObjId(p,pGVar6);
          if (lVar7 <= iVar5) {
            __assert_fail("Id < i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                          ,0x429,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
          }
          if (iVar4 <= piVar1[iVar5]) {
            iVar4 = piVar1[iVar5];
          }
        }
        iVar10 = DelayC;
        if ((uVar9 & 1) == 0) {
          iVar10 = 100;
        }
        piVar1[lVar7] = iVar4 + iVar10;
      }
    }
    else if ((~uVar9 & 0x1fffffff) == 0 || -1 < (int)uVar9) {
      if ((~uVar2 & 0x4000000040000000) == 0) {
        __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x43a,"int Gia_ManFindAnnotatedDelay(Gia_Man_t *, int, int *, int)");
      }
      iVar10 = piVar1[(int)(iVar4 - (uVar9 & 0x1fffffff))];
      iVar4 = piVar1[(int)(iVar4 - (uVar8 & 0x1fffffff))];
      if ((uVar9 >> 0x1e & 1) == 0) {
        if ((uVar2 & 0x4000000000000000) != 0) {
          iVar5 = iVar4 + DelayC;
          if (iVar4 + DelayC <= iVar10 + 100) {
            iVar5 = iVar10 + 100;
          }
          goto LAB_0053ae94;
        }
        iVar5 = iVar4 + 100;
        if (iVar4 + 100 < iVar10 + 100) {
          iVar5 = iVar10 + 100;
        }
      }
      else {
        iVar5 = iVar4 + 100;
        if (iVar4 + 100 < iVar10 + DelayC) {
          iVar5 = iVar10 + DelayC;
        }
LAB_0053ae94:
        local_60 = local_60 + 1;
      }
      piVar1[lVar7] = iVar5;
    }
    else {
      iVar4 = piVar1[(int)(iVar4 - (uVar9 & 0x1fffffff))];
      piVar1[lVar7] = iVar4;
      if (local_5c <= iVar4) {
        local_5c = iVar4;
      }
    }
  }
  if (pnBoxes != (int *)0x0) {
    *pnBoxes = local_60;
  }
  return local_5c;
}

Assistant:

int Gia_ManFindAnnotatedDelay( Gia_Man_t * p, int DelayC, int * pnBoxes, int fIgnoreBoxDelays )
{
    Gia_Obj_t * pObj;
    int nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    int * pDelays = Vec_IntArray(p->vLevels);
    int i, k, iBox, iBoxOutId, Delay, Delay0, Delay1, DelayMax = 0, nBoxes = 0;
    Vec_IntFill( p->vLevels, Gia_ManObjNum(p), 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( fIgnoreBoxDelays )
                continue;
            // check if it is real PI
            iBoxOutId = Gia_ObjCioId(pObj) - nRealPis;
            if ( iBoxOutId < 0 )
                continue;
            // if it is a box output, find box number
            iBox = iBoxOutId / 2;
            assert( iBox < Gia_ManBoxNum(p) );
            // check find the maximum delay of the box inputs
            Delay = 0;
            for ( k = 0; k < 3; k++ )
            {
                int Id = Gia_ObjId( p, Gia_ManCo(p, iBox*3+k) );
                assert( Id < i );
                Delay = Abc_MaxInt( Delay, pDelays[Id] );
            }
            // consider outputs
            if ( iBoxOutId & 1 ) // carry output
                Delay += DelayC;
            else // sum output
                Delay += 100;
            pDelays[i] = Delay;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            pDelays[i] = pDelays[Gia_ObjFaninId0(pObj, i)];
            DelayMax = Abc_MaxInt( DelayMax, pDelays[i] );
            continue;
        }
        assert( !pObj->fMark0 || !pObj->fMark1 );
        Delay0 = pDelays[Gia_ObjFaninId0(pObj, i)];
        Delay1 = pDelays[Gia_ObjFaninId1(pObj, i)];
        if ( pObj->fMark0 )
        {
            Delay = Abc_MaxInt( Delay0 + DelayC, Delay1 + 100 );
            nBoxes++;
        }
        else if ( pObj->fMark1 )
        {
            Delay = Abc_MaxInt( Delay1 + DelayC, Delay0 + 100 );
            nBoxes++;
        }
        else
            Delay = Abc_MaxInt( Delay0 + 100, Delay1 + 100 );
        pDelays[i] = Delay;
    }
    if ( pnBoxes )
        *pnBoxes = nBoxes;
    return DelayMax;
}